

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# body_centered_cubic.hpp
# Opt level: O0

vector __thiscall
sisl::body_centered_cubic<char>::get_natural_scales(body_centered_cubic<char> *this)

{
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this_00;
  Index extraout_RDX;
  long in_RSI;
  vector vVar1;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_40;
  int local_20;
  undefined1 local_19;
  body_centered_cubic<char> *this_local;
  vector *scales;
  
  local_19 = 0;
  local_20 = 3;
  this_local = this;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)this,&local_20);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
            (&local_40,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this,
             (Scalar *)(in_RSI + 0x20));
  this_00 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                      (&local_40,(Scalar *)(in_RSI + 0x28));
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
            (this_00,(Scalar *)(in_RSI + 0x30));
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_40);
  vVar1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  vVar1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (vector)vVar1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

virtual const vector get_natural_scales() const {
            vector scales(3);
            scales << _sx, _sy, _sz;
            return scales;
        }